

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stlio.hpp
# Opt level: O3

void __thiscall
tyti::stl::
stl_parser_binary<float,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::~stl_parser_binary
          (stl_parser_binary<float,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  boost::
  function4<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::fusion::nil_>_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  ::~function4(&(this->endSolid).f.
                super_function4<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::fusion::nil_>_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
              );
  pcVar1 = (this->endSolid).name_._M_dataplus._M_p;
  paVar2 = &(this->endSolid).name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  boost::
  function4<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<tyti::stl::basic_vec3<float>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  ::~function4(&(this->vector).f.
                super_function4<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<tyti::stl::basic_vec3<float>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
              );
  pcVar1 = (this->vector).name_._M_dataplus._M_p;
  paVar2 = &(this->vector).name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  boost::
  function4<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<tyti::stl::basic_solid<float>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  ::~function4(&(this->start).f.
                super_function4<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<tyti::stl::basic_solid<float>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
              );
  pcVar1 = (this->start).name_._M_dataplus._M_p;
  paVar2 = &(this->start).name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->
           super_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
           ).name_._M_dataplus._M_p;
  paVar2 = &(this->
            super_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
            ).name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

stl_parser_binary() : stl_parser_binary::base_type(start)
            {
                namespace spirit = boost::spirit;
                namespace qi = boost::spirit::qi;
                namespace ql = qi::labels;
                namespace ascii = boost::spirit::ascii;
                namespace px = boost::phoenix;

                vector %= spirit::little_bin_float >> spirit::little_bin_float >> spirit::little_bin_float;

                start =
                    qi::repeat(80)[spirit::byte_[px::at_c<0>(ql::_val) += ql::_1]]              //80x8-bit header
                    >> spirit::little_dword[px::reserve(px::at_c<1>(ql::_val), ql::_1),
                    px::reserve(px::at_c<2>(ql::_val), 3 * ql::_1),
                    px::reserve(px::at_c<3>(ql::_val), ql::_1)]    //# of triangles
                    >> *(vector[px::push_back(px::at_c<1>(ql::_val), ql::_1)]  //normal
                        >> spirit::repeat(3)[vector[px::push_back(px::at_c<2>(ql::_val), ql::_1)]] //vertices
                        >> spirit::little_word[px::push_back(px::at_c<3>(ql::_val), ql::_1)]  //attribute
                        )
                    //end
                    ;
            }